

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

IterationResult __thiscall helics::Federate::enterExecutingModeComplete(Federate *this)

{
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *psVar1;
  IterationResult IVar2;
  iteration_time iVar3;
  iteration_time res;
  handle asyncInfo;
  unique_lock<std::mutex> local_30;
  
  if ((this->singleThreadFederate != true) && ((this->currentMode)._M_i == PENDING_EXEC)) {
    psVar1 = (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl;
    local_30._M_device = &psVar1->m_mutex;
    local_30._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    iVar3 = std::future<helics::iteration_time>::get(&(psVar1->m_obj).execFuture);
    res._9_7_ = 0;
    res.grantedTime.internalTimeCode = (long)iVar3._0_9_;
    res.state = (char)(iVar3._0_9_ >> 0x40);
    enteringExecutingMode(this,res);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    return iVar3.state;
  }
  IVar2 = enterExecutingMode(this,NO_ITERATIONS);
  return IVar2;
}

Assistant:

IterationResult Federate::enterExecutingModeComplete()
{
    if (singleThreadFederate) {
        return enterExecutingMode();
    }
    switch (currentMode.load()) {
        case Modes::PENDING_EXEC: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                auto res = asyncInfo->execFuture.get();
                enteringExecutingMode(res);
                return res.state;
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        }
        default:
            return enterExecutingMode();
    }
}